

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O3

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
::~CompositeCodec(CompositeCodec<FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
                  *this)

{
  pointer puVar1;
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3470;
  (this->codec1).super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>.super_IntegerCODEC.
  _vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3110;
  puVar1 = (this->codec1).super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>.tobecoded.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->codec1).super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>.exceptions.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->codec1).super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>.exceptionsValues.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->codec1).super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>.exceptionsPositions.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}